

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O3

void ncnn::conv3x3s1_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [12];
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [16];
  int iVar48;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  void *pvVar54;
  ulong uVar55;
  undefined1 (*pauVar56) [16];
  undefined1 (*pauVar57) [16];
  long lVar58;
  int iVar59;
  undefined1 (*pauVar60) [16];
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  void *pvVar63;
  void *pvVar64;
  ulong uVar65;
  long lVar66;
  undefined1 (*pauVar67) [16];
  undefined1 (*pauVar68) [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [64];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  ulong local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 *local_78;
  
  uVar19 = bottom_blob->c;
  uVar20 = top_blob->w;
  iVar21 = top_blob->h;
  iVar22 = top_blob->c;
  uVar55 = (long)iVar22 & 0xfffffffffffffffe;
  if (0 < iVar22 >> 1) {
    uVar65 = 0;
    do {
      uVar51 = (long)top_blob->h * (long)top_blob->w;
      uVar52 = top_blob->elemsize;
      lVar66 = top_blob->cstep * uVar52;
      if (top_blob->dims != 4) {
        uVar51 = (uVar51 * uVar52 + 0xf & 0xfffffffffffffff0) / uVar52;
      }
      uVar52 = uVar65 * 2;
      uVar61 = uVar52 | 1;
      if (_bias == (Mat *)0x0) {
        auVar70 = ZEXT816(0) << 0x40;
        auVar69 = ZEXT816(0) << 0x40;
      }
      else {
        auVar70 = *(undefined1 (*) [16])(&_bias->data + uVar65 * 4);
        auVar69 = *(undefined1 (*) [16])(&_bias->data + uVar61 * 2);
      }
      pauVar53 = (undefined1 (*) [16])(lVar66 * uVar52 + (long)top_blob->data);
      pauVar67 = (undefined1 (*) [16])(lVar66 * uVar61 + (long)top_blob->data);
      iVar59 = top_blob->d * (int)uVar51;
      pauVar62 = pauVar53;
      iVar48 = iVar59;
      if (0 < iVar59) {
        do {
          *pauVar62 = auVar70;
          iVar48 = iVar48 + -1;
          pauVar62 = pauVar62 + 1;
        } while (iVar48 != 0);
        pauVar62 = pauVar67;
        if (0 < iVar59) {
          do {
            *pauVar62 = auVar69;
            iVar59 = iVar59 + -1;
            pauVar62 = pauVar62 + 1;
          } while (iVar59 != 0);
        }
      }
      if (0 < (int)uVar19) {
        pauVar62 = (undefined1 (*) [16])
                   (uVar61 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_78 = (undefined8 *)(uVar52 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_d8 = 0;
        do {
          if (0 < iVar21) {
            uVar37 = *local_78;
            uVar38 = local_78[1];
            pauVar1 = (undefined1 (*) [12])(local_78 + 2);
            auVar39 = *pauVar1;
            local_f8 = (float)*(undefined8 *)*pauVar1;
            fStack_f4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
            fStack_f0 = (float)local_78[3];
            fStack_ec = (float)((ulong)local_78[3] >> 0x20);
            auVar70 = *(undefined1 (*) [16])(local_78 + 4);
            auVar69 = *(undefined1 (*) [16])(local_78 + 6);
            auVar15 = *(undefined1 (*) [16])(local_78 + 8);
            fVar23 = *(float *)*(undefined1 (*) [12])(local_78 + 10);
            fVar24 = *(float *)((long)local_78 + 0x54);
            fVar25 = *(float *)(local_78 + 0xb);
            auVar44 = *(undefined1 (*) [12])(local_78 + 10);
            fVar26 = *(float *)((long)local_78 + 0x5c);
            auVar16 = *(undefined1 (*) [16])(local_78 + 0xc);
            fVar27 = *(float *)(local_78 + 0xe);
            fVar28 = *(float *)((long)local_78 + 0x74);
            fVar29 = *(float *)(local_78 + 0xf);
            fVar30 = *(float *)((long)local_78 + 0x7c);
            auVar17 = *(undefined1 (*) [16])(local_78 + 0x10);
            auVar71 = *pauVar62;
            auVar82 = ZEXT1664(auVar71);
            auVar42 = *(undefined1 (*) [12])pauVar62[1];
            auVar43 = pauVar62[1];
            fVar84 = *(float *)pauVar62[2];
            fVar85 = *(float *)(pauVar62[2] + 4);
            fVar86 = *(float *)(pauVar62[2] + 8);
            fVar87 = *(float *)(pauVar62[2] + 0xc);
            fVar88 = *(float *)pauVar62[3];
            fVar89 = *(float *)(pauVar62[3] + 4);
            fVar90 = *(float *)(pauVar62[3] + 8);
            fVar31 = *(float *)(pauVar62[3] + 0xc);
            fVar32 = *(float *)pauVar62[4];
            fVar33 = *(float *)(pauVar62[4] + 4);
            fVar34 = *(float *)(pauVar62[4] + 8);
            fVar35 = *(float *)(pauVar62[4] + 0xc);
            auVar72 = pauVar62[5];
            auVar73 = pauVar62[6];
            pvVar64 = (void *)(bottom_blob->cstep * local_d8 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar66 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar63 = (void *)((long)pvVar64 + lVar66 * 2);
            pvVar54 = (void *)(lVar66 + (long)pvVar64);
            iVar48 = 0;
            auVar18 = pauVar62[7];
            auVar94 = ZEXT1664(auVar18);
            pauVar57 = pauVar62 + 8;
            auVar41 = *(undefined1 (*) [12])*pauVar57;
            auVar40 = *(undefined1 (*) [12])*pauVar57;
            local_b8 = (float)*(undefined8 *)*pauVar57;
            fStack_b4 = (float)((ulong)*(undefined8 *)*pauVar57 >> 0x20);
            fStack_b0 = (float)*(undefined8 *)(pauVar62[8] + 8);
            fStack_ac = (float)((ulong)*(undefined8 *)(pauVar62[8] + 8) >> 0x20);
            pauVar57 = pauVar53;
            pauVar68 = pauVar67;
            do {
              local_1f8 = (float)uVar37;
              fStack_1f0 = (float)uVar38;
              local_1c8 = auVar70._0_4_;
              fStack_1c0 = auVar70._8_4_;
              fStack_1bc = auVar70._12_4_;
              local_198 = auVar69._0_4_;
              fStack_194 = auVar69._4_4_;
              fStack_190 = auVar69._8_4_;
              fStack_18c = auVar69._12_4_;
              local_1a8 = auVar15._0_4_;
              fStack_1a0 = auVar15._8_4_;
              fStack_19c = auVar15._12_4_;
              local_1d8 = auVar43._0_4_;
              fVar36 = local_1d8;
              fStack_1d0 = auVar43._8_4_;
              fStack_1cc = auVar43._12_4_;
              local_138 = auVar71._0_4_;
              fStack_134 = auVar71._4_4_;
              fStack_130 = auVar71._8_4_;
              fStack_12c = auVar71._12_4_;
              local_1b8 = auVar16._0_4_;
              fStack_1b4 = auVar16._4_4_;
              fStack_1b0 = auVar16._8_4_;
              fStack_1ac = auVar16._12_4_;
              fStack_124 = auVar72._4_4_;
              fStack_120 = auVar72._8_4_;
              fStack_11c = auVar72._12_4_;
              fStack_144 = auVar17._4_4_;
              fStack_140 = auVar17._8_4_;
              fStack_13c = auVar17._12_4_;
              local_108 = auVar73._0_4_;
              fStack_104 = auVar73._4_4_;
              fStack_100 = auVar73._8_4_;
              fStack_fc = auVar73._12_4_;
              fStack_1f4 = (float)((ulong)uVar37 >> 0x20);
              fStack_1ec = (float)((ulong)uVar38 >> 0x20);
              fStack_1c4 = auVar70._4_4_;
              fStack_1a4 = auVar15._4_4_;
              fStack_1d4 = auVar42._4_4_;
              fStack_c4 = auVar18._4_4_;
              fStack_c0 = auVar18._8_4_;
              fStack_bc = auVar18._12_4_;
              local_128 = auVar72._0_4_;
              local_148 = auVar17._0_4_;
              local_c8 = auVar18._0_4_;
              if ((int)uVar20 < 4) {
                uVar50 = 0;
              }
              else {
                iVar59 = 3;
                lVar66 = 0;
                pauVar47 = pauVar68;
                pauVar46 = pauVar57;
                do {
                  pauVar60 = pauVar46;
                  pauVar56 = pauVar47;
                  fVar4 = *(float *)((long)pvVar64 + lVar66);
                  fVar5 = *(float *)((long)pvVar64 + lVar66 + 4);
                  fVar6 = *(float *)((long)pvVar64 + lVar66 + 8);
                  fVar91 = *(float *)((long)pvVar54 + lVar66);
                  fVar92 = *(float *)((long)pvVar54 + lVar66 + 4);
                  fVar93 = *(float *)((long)pvVar54 + lVar66 + 8);
                  fVar7 = *(float *)((long)pvVar63 + lVar66);
                  pauVar46 = (undefined1 (*) [16])(pauVar57[4] + lVar66 * 4);
                  fVar10 = *(float *)(pauVar46[-4] + 4);
                  fVar11 = *(float *)(pauVar46[-4] + 8);
                  fVar12 = *(float *)(pauVar46[-4] + 0xc);
                  fVar8 = *(float *)((long)pvVar63 + lVar66 + 4);
                  local_1d8 = auVar42._0_4_;
                  fVar9 = *(float *)((long)pvVar63 + lVar66 + 8);
                  pauVar47 = (undefined1 (*) [16])(pauVar68[4] + lVar66 * 4);
                  fVar13 = *(float *)pauVar47[-4];
                  fVar14 = *(float *)(pauVar47[-4] + 4);
                  fVar79 = *(float *)(pauVar47[-4] + 8);
                  fVar80 = *(float *)(pauVar47[-4] + 0xc);
                  *(float *)pauVar46[-4] =
                       fVar5 * local_f8 + fVar6 * local_1c8 + fVar91 * local_198 + fVar93 * fVar23 +
                       fVar8 * fVar27 +
                       fVar92 * local_1a8 + fVar4 * local_1f8 + *(float *)pauVar46[-4] +
                       fVar7 * local_1b8 + fVar9 * local_148;
                  *(float *)(pauVar46[-4] + 4) =
                       fVar5 * fStack_f4 + fVar6 * fStack_1c4 + fVar91 * fStack_194 +
                       fVar93 * fVar24 + fVar8 * fVar28 +
                       fVar92 * fStack_1a4 + fVar4 * fStack_1f4 + fVar10 + fVar7 * fStack_1b4 +
                       fVar9 * fStack_144;
                  *(float *)(pauVar46[-4] + 8) =
                       fVar5 * fStack_f0 + fVar6 * fStack_1c0 + fVar91 * fStack_190 +
                       fVar93 * fVar25 + fVar8 * fVar29 +
                       fVar92 * fStack_1a0 + fVar4 * fStack_1f0 + fVar11 + fVar7 * fStack_1b0 +
                       fVar9 * fStack_140;
                  *(float *)(pauVar46[-4] + 0xc) =
                       fVar5 * fStack_ec + fVar6 * fStack_1bc + fVar91 * fStack_18c +
                       fVar93 * fVar26 + fVar8 * fVar30 +
                       fVar92 * fStack_19c + fVar4 * fStack_1ec + fVar12 + fVar7 * fStack_1ac +
                       fVar9 * fStack_13c;
                  *(float *)pauVar47[-4] =
                       fVar6 * fVar84 + fVar5 * local_1d8 + fVar91 * fVar88 + fVar93 * local_128 +
                       fVar8 * local_c8 +
                       fVar9 * local_b8 +
                       fVar92 * fVar32 + fVar4 * local_138 + fVar13 + fVar7 * local_108;
                  *(float *)(pauVar47[-4] + 4) =
                       fVar6 * fVar85 + fVar5 * fStack_1d4 + fVar91 * fVar89 + fVar93 * fStack_124 +
                       fVar8 * fStack_c4 +
                       fVar9 * fStack_b4 +
                       fVar92 * fVar33 + fVar4 * fStack_134 + fVar14 + fVar7 * fStack_104;
                  *(float *)(pauVar47[-4] + 8) =
                       fVar6 * fVar86 + fVar5 * fStack_1d0 + fVar91 * fVar90 + fVar93 * fStack_120 +
                       fVar8 * fStack_c0 +
                       fVar9 * fStack_b0 +
                       fVar92 * fVar34 + fVar4 * fStack_130 + fVar79 + fVar7 * fStack_100;
                  *(float *)(pauVar47[-4] + 0xc) =
                       fVar6 * fVar87 + fVar5 * fStack_1cc + fVar91 * fVar31 + fVar93 * fStack_11c +
                       fVar8 * fStack_bc +
                       fVar9 * fStack_ac +
                       fVar92 * fVar35 + fVar4 * fStack_12c + fVar80 + fVar7 * fStack_fc;
                  fVar4 = *(float *)((long)pvVar64 + lVar66 + 0xc);
                  fVar91 = *(float *)((long)pvVar54 + lVar66 + 0xc);
                  fVar7 = *(float *)((long)pvVar63 + lVar66 + 0xc);
                  fVar10 = *(float *)(pauVar46[-3] + 4);
                  fVar11 = *(float *)(pauVar46[-3] + 8);
                  fVar12 = *(float *)(pauVar46[-3] + 0xc);
                  fVar13 = *(float *)pauVar47[-3];
                  fVar14 = *(float *)(pauVar47[-3] + 4);
                  fVar79 = *(float *)(pauVar47[-3] + 8);
                  fVar80 = *(float *)(pauVar47[-3] + 0xc);
                  *(float *)pauVar46[-3] =
                       fVar6 * local_f8 + fVar5 * local_1f8 +
                       fVar93 * local_1a8 + fVar92 * local_198 + fVar8 * local_1b8 +
                       *(float *)pauVar46[-3] +
                       fVar4 * local_1c8 + fVar9 * fVar27 + fVar91 * fVar23 + fVar7 * local_148;
                  *(float *)(pauVar46[-3] + 4) =
                       fVar6 * fStack_f4 + fVar5 * fStack_1f4 +
                       fVar93 * fStack_1a4 + fVar92 * fStack_194 + fVar8 * fStack_1b4 + fVar10 +
                       fVar4 * fStack_1c4 + fVar9 * fVar28 + fVar91 * fVar24 + fVar7 * fStack_144;
                  *(float *)(pauVar46[-3] + 8) =
                       fVar6 * fStack_f0 + fVar5 * fStack_1f0 +
                       fVar93 * fStack_1a0 + fVar92 * fStack_190 + fVar8 * fStack_1b0 + fVar11 +
                       fVar4 * fStack_1c0 + fVar9 * fVar29 + fVar91 * fVar25 + fVar7 * fStack_140;
                  *(float *)(pauVar46[-3] + 0xc) =
                       fVar6 * fStack_ec + fVar5 * fStack_1ec +
                       fVar93 * fStack_19c + fVar92 * fStack_18c + fVar8 * fStack_1ac + fVar12 +
                       fVar4 * fStack_1bc + fVar9 * fVar30 + fVar91 * fVar26 + fVar7 * fStack_13c;
                  *(float *)pauVar47[-3] =
                       fVar6 * local_1d8 + fVar5 * local_138 + fVar92 * fVar88 + fVar93 * fVar32 +
                       fVar8 * local_108 + fVar9 * local_c8 + fVar13 +
                       fVar4 * fVar84 + fVar91 * local_128 + fVar7 * local_b8;
                  *(float *)(pauVar47[-3] + 4) =
                       fVar6 * fStack_1d4 + fVar5 * fStack_134 + fVar92 * fVar89 + fVar93 * fVar33 +
                       fVar8 * fStack_104 + fVar9 * fStack_c4 + fVar14 +
                       fVar4 * fVar85 + fVar91 * fStack_124 + fVar7 * fStack_b4;
                  *(float *)(pauVar47[-3] + 8) =
                       fVar6 * fStack_1d0 + fVar5 * fStack_130 + fVar92 * fVar90 + fVar93 * fVar34 +
                       fVar8 * fStack_100 + fVar9 * fStack_c0 + fVar79 +
                       fVar4 * fVar86 + fVar91 * fStack_120 + fVar7 * fStack_b0;
                  *(float *)(pauVar47[-3] + 0xc) =
                       fVar6 * fStack_1cc + fVar5 * fStack_12c + fVar92 * fVar31 + fVar93 * fVar35 +
                       fVar8 * fStack_fc + fVar9 * fStack_bc + fVar80 +
                       fVar4 * fVar87 + fVar91 * fStack_11c + fVar7 * fStack_ac;
                  fVar5 = *(float *)((long)pvVar64 + lVar66 + 0x10);
                  fVar92 = *(float *)((long)pvVar54 + lVar66 + 0x10);
                  fVar8 = *(float *)((long)pvVar63 + lVar66 + 0x10);
                  fVar10 = *(float *)(pauVar46[-2] + 4);
                  fVar11 = *(float *)(pauVar46[-2] + 8);
                  fVar12 = *(float *)(pauVar46[-2] + 0xc);
                  fVar13 = *(float *)pauVar47[-2];
                  fVar14 = *(float *)(pauVar47[-2] + 4);
                  fVar79 = *(float *)(pauVar47[-2] + 8);
                  fVar80 = *(float *)(pauVar47[-2] + 0xc);
                  *(float *)pauVar46[-2] =
                       fVar93 * local_198 + fVar6 * local_1f8 + fVar9 * local_1b8 + fVar4 * local_f8
                       + fVar91 * local_1a8 + *(float *)pauVar46[-2] +
                       fVar7 * fVar27 + fVar5 * local_1c8 + fVar92 * auVar44._0_4_ +
                       local_148 * fVar8;
                  *(float *)(pauVar46[-2] + 4) =
                       fVar93 * fStack_194 + fVar6 * fStack_1f4 +
                       fVar9 * fStack_1b4 + fVar4 * fStack_f4 + fVar91 * fStack_1a4 + fVar10 +
                       fVar7 * fVar28 + fVar5 * fStack_1c4 + fVar92 * auVar44._4_4_ +
                       fStack_144 * fVar8;
                  *(float *)(pauVar46[-2] + 8) =
                       fVar93 * fStack_190 + fVar6 * fStack_1f0 +
                       fVar9 * fStack_1b0 + fVar4 * fStack_f0 + fVar91 * fStack_1a0 + fVar11 +
                       fVar7 * fVar29 + fVar5 * fStack_1c0 + fVar92 * auVar44._8_4_ +
                       fStack_140 * fVar8;
                  *(float *)(pauVar46[-2] + 0xc) =
                       fVar93 * fStack_18c + fVar6 * fStack_1ec +
                       fVar9 * fStack_1ac + fVar4 * fStack_ec + fVar91 * fStack_19c + fVar12 +
                       fVar7 * fVar30 + fVar5 * fStack_1bc + fVar92 * fVar26 + fStack_13c * fVar8;
                  *(float *)pauVar47[-2] =
                       fVar5 * fVar84 + fVar92 * local_128 + local_b8 * fVar8 +
                       fVar91 * fVar32 + local_c8 * fVar7 +
                       fVar6 * local_138 + fVar93 * fVar88 + fVar4 * fVar36 + fVar9 * local_108 +
                       fVar13;
                  *(float *)(pauVar47[-2] + 4) =
                       fVar5 * fVar85 + fVar92 * fStack_124 + fStack_b4 * fVar8 +
                       fVar91 * fVar33 + fStack_c4 * fVar7 +
                       fVar6 * fStack_134 + fVar93 * fVar89 +
                       fVar4 * fStack_1d4 + fVar9 * fStack_104 + fVar14;
                  *(float *)(pauVar47[-2] + 8) =
                       fVar5 * fVar86 + fVar92 * fStack_120 + fStack_b0 * fVar8 +
                       fVar91 * fVar34 + fStack_c0 * fVar7 +
                       fVar6 * fStack_130 + fVar93 * fVar90 +
                       fVar4 * fStack_1d0 + fVar9 * fStack_100 + fVar79;
                  *(float *)(pauVar47[-2] + 0xc) =
                       fVar5 * fVar87 + fVar92 * fStack_11c + fStack_ac * fVar8 +
                       fVar91 * fVar35 + fStack_bc * fVar7 +
                       fVar6 * fStack_12c + fVar93 * fVar31 + fVar4 * fStack_1cc + fVar9 * fStack_fc
                       + fVar80;
                  fVar6 = *(float *)((long)pvVar64 + lVar66 + 0x14);
                  fVar93 = *(float *)((long)pvVar54 + lVar66 + 0x14);
                  fVar9 = *(float *)((long)pvVar63 + lVar66 + 0x14);
                  auVar77._0_4_ =
                       fVar92 * local_1a8 + fVar8 * fVar27 +
                       fVar7 * local_1b8 + fVar5 * local_f8 + fVar91 * local_198 + fVar4 * local_1f8
                       + *(float *)pauVar46[-1] +
                       fVar93 * auVar44._0_4_ + fVar6 * local_1c8 + fVar9 * local_148;
                  auVar77._4_4_ =
                       fVar92 * fStack_1a4 + fVar8 * fVar28 +
                       fVar7 * fStack_1b4 + fVar5 * fStack_f4 +
                       fVar91 * fStack_194 + fVar4 * fStack_1f4 + *(float *)(pauVar46[-1] + 4) +
                       fVar93 * auVar44._4_4_ + fVar6 * fStack_1c4 + fVar9 * fStack_144;
                  auVar77._8_4_ =
                       fVar92 * fStack_1a0 + fVar8 * fVar29 +
                       fVar7 * fStack_1b0 + fVar5 * fStack_f0 +
                       fVar91 * fStack_190 + fVar4 * fStack_1f0 + *(float *)(pauVar46[-1] + 8) +
                       fVar93 * auVar44._8_4_ + fVar6 * fStack_1c0 + fVar9 * fStack_140;
                  auVar77._12_4_ =
                       fVar92 * fStack_19c + fVar8 * fVar30 +
                       fVar7 * fStack_1ac + fVar5 * fStack_ec +
                       fVar91 * fStack_18c + fVar4 * fStack_1ec + *(float *)(pauVar46[-1] + 0xc) +
                       fVar93 * fVar26 + fVar6 * fStack_1bc + fVar9 * fStack_13c;
                  auVar74._0_4_ =
                       fVar91 * fVar88 + fVar4 * local_138 + fVar5 * fVar36 + fVar7 * local_108 +
                       fVar92 * fVar32 + fVar8 * local_c8 + fVar6 * fVar84 + *(float *)pauVar47[-1]
                       + fVar93 * local_128 + fVar9 * local_b8;
                  auVar74._4_4_ =
                       fVar91 * fVar89 + fVar4 * fStack_134 +
                       fVar5 * fStack_1d4 + fVar7 * fStack_104 +
                       fVar92 * fVar33 + fVar8 * fStack_c4 + fVar6 * fVar85 +
                       *(float *)(pauVar47[-1] + 4) + fVar93 * fStack_124 + fVar9 * fStack_b4;
                  auVar74._8_4_ =
                       fVar91 * fVar90 + fVar4 * fStack_130 +
                       fVar5 * fStack_1d0 + fVar7 * fStack_100 +
                       fVar92 * fVar34 + fVar8 * fStack_c0 + fVar6 * fVar86 +
                       *(float *)(pauVar47[-1] + 8) + fVar93 * fStack_120 + fVar9 * fStack_b0;
                  auVar74._12_4_ =
                       fVar91 * fVar31 + fVar4 * fStack_12c + fVar5 * fStack_1cc + fVar7 * fStack_fc
                       + fVar92 * fVar35 + fVar8 * fStack_bc + fVar6 * fVar87 +
                       *(float *)(pauVar47[-1] + 0xc) + fVar93 * fStack_11c + fVar9 * fStack_ac;
                  pauVar46[-1] = auVar77;
                  pauVar47[-1] = auVar74;
                  iVar59 = iVar59 + 4;
                  lVar66 = lVar66 + 0x10;
                } while (iVar59 < (int)uVar20);
                pauVar57 = pauVar60 + 4;
                pauVar68 = pauVar56 + 4;
                pvVar63 = (void *)((long)pvVar63 + lVar66);
                pvVar54 = (void *)((long)pvVar54 + lVar66);
                pvVar64 = (void *)((long)pvVar64 + lVar66);
                auVar82 = ZEXT1664(auVar71);
                auVar94 = ZEXT1664(auVar18);
                uVar50 = uVar20 & 0xfffffffc;
              }
              if ((int)(uVar50 | 1) < (int)uVar20) {
                lVar66 = 0;
                pauVar46 = pauVar57;
                pauVar47 = pauVar68;
                uVar49 = uVar50;
                do {
                  pauVar60 = pauVar47;
                  pauVar56 = pauVar46;
                  fVar4 = *(float *)((long)pvVar64 + lVar66);
                  fVar5 = *(float *)((long)pvVar64 + lVar66 + 4);
                  fVar6 = *(float *)((long)pvVar64 + lVar66 + 8);
                  fVar91 = *(float *)((long)pvVar54 + lVar66);
                  fVar92 = *(float *)((long)pvVar54 + lVar66 + 4);
                  fVar93 = *(float *)((long)pvVar54 + lVar66 + 8);
                  fVar7 = *(float *)((long)pvVar63 + lVar66);
                  pauVar46 = (undefined1 (*) [16])(pauVar57[2] + lVar66 * 4);
                  fVar10 = *(float *)(pauVar46[-2] + 4);
                  fVar11 = *(float *)(pauVar46[-2] + 8);
                  fVar12 = *(float *)(pauVar46[-2] + 0xc);
                  fVar8 = *(float *)((long)pvVar63 + lVar66 + 4);
                  pauVar47 = (undefined1 (*) [16])(pauVar68[2] + lVar66 * 4);
                  fVar13 = *(float *)pauVar47[-2];
                  fVar14 = *(float *)(pauVar47[-2] + 4);
                  fVar79 = *(float *)(pauVar47[-2] + 8);
                  fVar80 = *(float *)(pauVar47[-2] + 0xc);
                  fVar9 = *(float *)((long)pvVar63 + lVar66 + 8);
                  *(float *)pauVar46[-2] =
                       fVar4 * local_1f8 + *(float *)pauVar46[-2] + local_1a8 * fVar92 +
                       fVar7 * local_1b8 + fVar9 * local_148 +
                       auVar39._0_4_ * fVar5 + fVar6 * local_1c8 + fVar91 * local_198 +
                       fVar93 * fVar23 + fVar8 * fVar27;
                  *(float *)(pauVar46[-2] + 4) =
                       fVar4 * fStack_1f4 + fVar10 + fStack_1a4 * fVar92 + fVar7 * fStack_1b4 +
                       fVar9 * fStack_144 +
                       auVar39._4_4_ * fVar5 + fVar6 * fStack_1c4 + fVar91 * fStack_194 +
                       fVar93 * fVar24 + fVar8 * fVar28;
                  *(float *)(pauVar46[-2] + 8) =
                       fVar4 * fStack_1f0 + fVar11 + fStack_1a0 * fVar92 + fVar7 * fStack_1b0 +
                       fVar9 * fStack_140 +
                       auVar39._8_4_ * fVar5 + fVar6 * fStack_1c0 + fVar91 * fStack_190 +
                       fVar93 * fVar25 + fVar8 * fVar29;
                  *(float *)(pauVar46[-2] + 0xc) =
                       fVar4 * fStack_1ec + fVar12 + fStack_19c * fVar92 + fVar7 * fStack_1ac +
                       fVar9 * fStack_13c +
                       fStack_ec * fVar5 + fVar6 * fStack_1bc + fVar91 * fStack_18c +
                       fVar93 * fVar26 + fVar8 * fVar30;
                  *(float *)pauVar47[-2] =
                       fVar4 * local_138 + fVar13 + fVar32 * fVar92 + fVar7 * local_108 +
                       fVar9 * auVar40._0_4_ +
                       fVar93 * local_128 + fVar5 * fVar36 + fVar6 * fVar84 + fVar91 * fVar88 +
                       fVar8 * local_c8;
                  *(float *)(pauVar47[-2] + 4) =
                       fVar4 * fStack_134 + fVar14 + fVar33 * fVar92 + fVar7 * fStack_104 +
                       fVar9 * auVar40._4_4_ +
                       fVar93 * fStack_124 + fVar5 * fStack_1d4 + fVar6 * fVar85 + fVar91 * fVar89 +
                       fVar8 * fStack_c4;
                  *(float *)(pauVar47[-2] + 8) =
                       fVar4 * fStack_130 + fVar79 + fVar34 * fVar92 + fVar7 * fStack_100 +
                       fVar9 * auVar40._8_4_ +
                       fVar93 * fStack_120 + fVar5 * fStack_1d0 + fVar6 * fVar86 + fVar91 * fVar90 +
                       fVar8 * fStack_c0;
                  *(float *)(pauVar47[-2] + 0xc) =
                       fVar4 * fStack_12c + fVar80 + fVar35 * fVar92 + fVar7 * fStack_fc +
                       fVar9 * fStack_ac +
                       fVar93 * fStack_11c + fVar5 * fStack_1cc + fVar6 * fVar87 + fVar91 * fVar31 +
                       fVar8 * fStack_bc;
                  fVar4 = *(float *)((long)pvVar64 + lVar66 + 0xc);
                  fVar91 = *(float *)((long)pvVar54 + lVar66 + 0xc);
                  fVar7 = *(float *)((long)pvVar63 + lVar66 + 0xc);
                  auVar78._0_4_ =
                       auVar39._0_4_ * fVar6 + fVar5 * local_1f8 +
                       fVar92 * local_198 + local_1a8 * fVar93 + fVar8 * local_1b8 +
                       *(float *)pauVar46[-1] +
                       fVar9 * fVar27 + fVar4 * local_1c8 + fVar91 * fVar23 + fVar7 * local_148;
                  auVar78._4_4_ =
                       auVar39._4_4_ * fVar6 + fVar5 * fStack_1f4 +
                       fVar92 * fStack_194 + fStack_1a4 * fVar93 + fVar8 * fStack_1b4 +
                       *(float *)(pauVar46[-1] + 4) +
                       fVar9 * fVar28 + fVar4 * fStack_1c4 + fVar91 * fVar24 + fVar7 * fStack_144;
                  auVar78._8_4_ =
                       auVar39._8_4_ * fVar6 + fVar5 * fStack_1f0 +
                       fVar92 * fStack_190 + fStack_1a0 * fVar93 + fVar8 * fStack_1b0 +
                       *(float *)(pauVar46[-1] + 8) +
                       fVar9 * fVar29 + fVar4 * fStack_1c0 + fVar91 * fVar25 + fVar7 * fStack_140;
                  auVar78._12_4_ =
                       fStack_ec * fVar6 + fVar5 * fStack_1ec +
                       fVar92 * fStack_18c + fStack_19c * fVar93 + fVar8 * fStack_1ac +
                       *(float *)(pauVar46[-1] + 0xc) +
                       fVar9 * fVar30 + fVar4 * fStack_1bc + fVar91 * fVar26 + fVar7 * fStack_13c;
                  auVar75._0_4_ =
                       fVar6 * fVar36 + fVar5 * local_138 + fVar92 * fVar88 + fVar32 * fVar93 +
                       fVar8 * local_108 + fVar9 * local_c8 + *(float *)pauVar47[-1] +
                       fVar4 * fVar84 + fVar91 * local_128 + fVar7 * auVar40._0_4_;
                  auVar75._4_4_ =
                       fVar6 * fStack_1d4 + fVar5 * fStack_134 + fVar92 * fVar89 + fVar33 * fVar93 +
                       fVar8 * fStack_104 + fVar9 * fStack_c4 + *(float *)(pauVar47[-1] + 4) +
                       fVar4 * fVar85 + fVar91 * fStack_124 + fVar7 * auVar40._4_4_;
                  auVar75._8_4_ =
                       fVar6 * fStack_1d0 + fVar5 * fStack_130 + fVar92 * fVar90 + fVar34 * fVar93 +
                       fVar8 * fStack_100 + fVar9 * fStack_c0 + *(float *)(pauVar47[-1] + 8) +
                       fVar4 * fVar86 + fVar91 * fStack_120 + fVar7 * auVar40._8_4_;
                  auVar75._12_4_ =
                       fVar6 * fStack_1cc + fVar5 * fStack_12c + fVar92 * fVar31 + fVar35 * fVar93 +
                       fVar8 * fStack_fc + fVar9 * fStack_bc + *(float *)(pauVar47[-1] + 0xc) +
                       fVar4 * fVar87 + fVar91 * fStack_11c + fVar7 * fStack_ac;
                  pauVar46[-1] = auVar78;
                  pauVar47[-1] = auVar75;
                  uVar50 = uVar49 + 2;
                  iVar59 = uVar49 + 3;
                  lVar66 = lVar66 + 8;
                  uVar49 = uVar50;
                } while (iVar59 < (int)uVar20);
                pauVar57 = pauVar56 + 2;
                pauVar68 = pauVar60 + 2;
                pvVar63 = (void *)((long)pvVar63 + lVar66);
                pvVar54 = (void *)((long)pvVar54 + lVar66);
                pvVar64 = (void *)((long)pvVar64 + lVar66);
                auVar82 = ZEXT1664(auVar71);
                auVar94 = ZEXT1664(auVar18);
              }
              auVar45 = *pauVar1;
              iVar59 = uVar20 - uVar50;
              if (iVar59 != 0 && (int)uVar50 <= (int)uVar20) {
                lVar66 = 0;
                lVar58 = 0;
                auVar83 = auVar82;
                do {
                  fVar4 = *(float *)((long)pvVar64 + lVar58);
                  fVar5 = *(float *)((long)pvVar64 + lVar58 + 4);
                  fVar6 = *(float *)((long)pvVar64 + lVar58 + 8);
                  fVar91 = *(float *)((long)pvVar54 + lVar58);
                  fVar92 = *(float *)((long)pvVar54 + lVar58 + 4);
                  fVar93 = *(float *)((long)pvVar54 + lVar58 + 8);
                  fVar7 = *(float *)((long)pvVar63 + lVar58);
                  fVar8 = *(float *)((long)pvVar63 + lVar58 + 4);
                  fVar9 = *(float *)((long)pvVar63 + lVar58 + 8);
                  pfVar3 = (float *)((long)*pauVar57 + lVar58 * 4);
                  fVar10 = pfVar3[1];
                  fVar11 = pfVar3[2];
                  fVar12 = pfVar3[3];
                  auVar82 = ZEXT1664(auVar83._0_16_);
                  pfVar2 = (float *)((long)*pauVar68 + lVar58 * 4);
                  auVar76._0_4_ =
                       fVar92 * fVar32 + fVar4 * auVar83._0_4_ + *pfVar2 + fVar7 * local_108 +
                       fVar9 * auVar41._0_4_ +
                       fVar91 * fVar88 + fVar6 * fVar84 + fVar5 * fVar36 + fVar93 * local_128 +
                       auVar94._0_4_ * fVar8;
                  auVar76._4_4_ =
                       fVar92 * fVar33 + fVar4 * auVar83._4_4_ + pfVar2[1] + fVar7 * fStack_104 +
                       fVar9 * auVar41._4_4_ +
                       fVar91 * fVar89 + fVar6 * fVar85 + fVar5 * fStack_1d4 + fVar93 * fStack_124 +
                       auVar94._4_4_ * fVar8;
                  auVar76._8_4_ =
                       fVar92 * fVar34 + fVar4 * auVar83._8_4_ + pfVar2[2] + fVar7 * fStack_100 +
                       fVar9 * auVar41._8_4_ +
                       fVar91 * fVar90 + fVar6 * fVar86 + fVar5 * fStack_1d0 + fVar93 * fStack_120 +
                       auVar94._8_4_ * fVar8;
                  auVar76._12_4_ =
                       fVar92 * fVar35 + fVar4 * auVar83._12_4_ + pfVar2[3] + fVar7 * fStack_fc +
                       fVar9 * fStack_ac +
                       fVar91 * fVar31 + fVar6 * fVar87 + fVar5 * fStack_1cc + fVar93 * fStack_11c +
                       auVar94._12_4_ * fVar8;
                  pfVar2 = (float *)((long)*pauVar57 + lVar58 * 4);
                  *pfVar2 = fVar4 * local_1f8 + *pfVar3 + fVar92 * local_1a8 + fVar7 * local_1b8 +
                            fVar9 * local_148 +
                            auVar45._0_4_ * fVar5 + fVar6 * local_1c8 + fVar91 * local_198 +
                            fVar93 * fVar23 + fVar8 * fVar27;
                  pfVar2[1] = fVar4 * fStack_1f4 + fVar10 + fVar92 * fStack_1a4 + fVar7 * fStack_1b4
                              + fVar9 * fStack_144 +
                              auVar45._4_4_ * fVar5 + fVar6 * fStack_1c4 + fVar91 * fStack_194 +
                              fVar93 * fVar24 + fVar8 * fVar28;
                  pfVar2[2] = fVar4 * fStack_1f0 + fVar11 + fVar92 * fStack_1a0 + fVar7 * fStack_1b0
                              + fVar9 * fStack_140 +
                              auVar45._8_4_ * fVar5 + fVar6 * fStack_1c0 + fVar91 * fStack_190 +
                              fVar93 * fVar25 + fVar8 * fVar29;
                  pfVar2[3] = fVar4 * fStack_1ec + fVar12 + fVar92 * fStack_19c + fVar7 * fStack_1ac
                              + fVar9 * fStack_13c +
                              fStack_ec * fVar5 + fVar6 * fStack_1bc + fVar91 * fStack_18c +
                              fVar93 * fVar26 + fVar8 * fVar30;
                  *(undefined1 (*) [16])((long)*pauVar68 + lVar58 * 4) = auVar76;
                  lVar58 = lVar58 + 4;
                  lVar66 = lVar66 + -0x10;
                  iVar59 = iVar59 + -1;
                  auVar83 = auVar82;
                } while (iVar59 != 0);
                pvVar63 = (void *)((long)pvVar63 + lVar58);
                pvVar54 = (void *)((long)pvVar54 + lVar58);
                pvVar64 = (void *)((long)pvVar64 + lVar58);
                pauVar68 = (undefined1 (*) [16])((long)pauVar68 - lVar66);
                pauVar57 = (undefined1 (*) [16])((long)pauVar57 - lVar66);
                auVar94 = ZEXT1664(auVar94._0_16_);
              }
              pvVar64 = (void *)((long)pvVar64 + 8);
              pvVar54 = (void *)((long)pvVar54 + 8);
              pvVar63 = (void *)((long)pvVar63 + 8);
              iVar48 = iVar48 + 1;
            } while (iVar48 != iVar21);
          }
          local_78 = local_78 + 0x12;
          pauVar62 = pauVar62 + 9;
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar19);
      }
      uVar65 = uVar65 + 1;
    } while (uVar65 != (uint)(iVar22 >> 1));
  }
  if ((int)uVar55 != iVar22) {
    do {
      uVar51 = (long)top_blob->h * (long)top_blob->w;
      uVar65 = top_blob->elemsize;
      uVar52 = (uVar65 * uVar51 + 0xf & 0xfffffffffffffff0) / uVar65;
      if (top_blob->dims == 4) {
        uVar52 = uVar51;
      }
      if (_bias == (Mat *)0x0) {
        auVar70 = ZEXT816(0) << 0x40;
      }
      else {
        auVar70 = *(undefined1 (*) [16])(&_bias->data + uVar55 * 2);
      }
      pauVar53 = (undefined1 (*) [16])(top_blob->cstep * uVar55 * uVar65 + (long)top_blob->data);
      iVar48 = (int)uVar52 * top_blob->d;
      pauVar62 = pauVar53;
      if (0 < iVar48) {
        do {
          *pauVar62 = auVar70;
          iVar48 = iVar48 + -1;
          pauVar62 = pauVar62 + 1;
        } while (iVar48 != 0);
      }
      if (0 < (int)uVar19) {
        pauVar62 = (undefined1 (*) [16])
                   (kernel->cstep * uVar55 * kernel->elemsize + (long)kernel->data);
        uVar65 = 0;
        do {
          if (0 < iVar21) {
            auVar70 = *pauVar62;
            pauVar67 = pauVar62 + 1;
            fVar88 = *(float *)*pauVar67;
            fVar89 = *(float *)(pauVar62[1] + 4);
            fVar90 = *(float *)(pauVar62[1] + 8);
            auVar40 = *(undefined1 (*) [12])*pauVar67;
            fVar31 = *(float *)(pauVar62[1] + 0xc);
            auVar17 = *pauVar67;
            fVar36 = *(float *)pauVar62[2];
            fVar4 = *(float *)(pauVar62[2] + 4);
            uVar37 = *(undefined8 *)pauVar62[2];
            fVar5 = *(float *)(pauVar62[2] + 8);
            fVar6 = *(float *)(pauVar62[2] + 0xc);
            uVar38 = *(undefined8 *)(pauVar62[2] + 8);
            fVar27 = *(float *)pauVar62[3];
            fVar28 = *(float *)(pauVar62[3] + 4);
            fVar29 = *(float *)(pauVar62[3] + 8);
            auVar42 = *(undefined1 (*) [12])pauVar62[3];
            fVar30 = *(float *)(pauVar62[3] + 0xc);
            auVar69 = pauVar62[4];
            auVar15 = pauVar62[5];
            pauVar67 = pauVar62 + 6;
            fVar32 = *(float *)*pauVar67;
            fVar33 = *(float *)(pauVar62[6] + 4);
            fVar34 = *(float *)(pauVar62[6] + 8);
            auVar44 = *(undefined1 (*) [12])*pauVar67;
            auVar41 = *(undefined1 (*) [12])*pauVar67;
            fVar35 = *(float *)(pauVar62[6] + 0xc);
            pauVar67 = pauVar62 + 7;
            fVar84 = *(float *)*pauVar67;
            fVar85 = *(float *)(pauVar62[7] + 4);
            fVar86 = *(float *)(pauVar62[7] + 8);
            auVar39 = *(undefined1 (*) [12])*pauVar67;
            fVar87 = *(float *)(pauVar62[7] + 0xc);
            auVar16 = *pauVar67;
            fVar23 = *(float *)pauVar62[8];
            fVar24 = *(float *)(pauVar62[8] + 4);
            fVar25 = *(float *)(pauVar62[8] + 8);
            fVar26 = *(float *)(pauVar62[8] + 0xc);
            pvVar64 = (void *)(bottom_blob->cstep * uVar65 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar66 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar63 = (void *)((long)pvVar64 + lVar66 * 2);
            pvVar54 = (void *)(lVar66 + (long)pvVar64);
            iVar48 = 0;
            pauVar67 = pauVar53;
            fVar91 = fVar31;
            fVar92 = fVar36;
            fVar93 = fVar5;
            do {
              fStack_1a4 = auVar17._4_4_;
              fStack_1a0 = auVar17._8_4_;
              fStack_19c = auVar17._12_4_;
              local_1f8 = (float)uVar37;
              fStack_1f0 = (float)uVar38;
              fStack_1b4 = auVar70._4_4_;
              fStack_1b0 = auVar70._8_4_;
              fStack_1ac = auVar70._12_4_;
              local_1c8 = auVar15._0_4_;
              fStack_1c4 = auVar15._4_4_;
              fStack_1c0 = auVar15._8_4_;
              fStack_1bc = auVar15._12_4_;
              local_198 = auVar16._0_4_;
              fVar9 = local_198;
              fStack_194 = auVar16._4_4_;
              fStack_190 = auVar16._8_4_;
              fStack_18c = auVar16._12_4_;
              fVar7 = auVar40._4_4_;
              fVar8 = auVar40._8_4_;
              local_1b8 = auVar70._0_4_;
              local_1d8 = auVar69._0_4_;
              fStack_1d4 = auVar69._4_4_;
              fStack_1d0 = auVar69._8_4_;
              fStack_1cc = auVar69._12_4_;
              local_1a8 = auVar40._0_4_;
              if ((int)uVar20 < 4) {
                uVar50 = 0;
                pauVar57 = pauVar67;
              }
              else {
                iVar59 = 3;
                lVar66 = 0;
                pauVar57 = pauVar67;
                do {
                  pauVar68 = pauVar57;
                  fVar84 = *(float *)((long)pvVar64 + lVar66);
                  fVar85 = *(float *)((long)pvVar64 + lVar66 + 4);
                  fVar86 = *(float *)((long)pvVar64 + lVar66 + 8);
                  fVar87 = *(float *)((long)pvVar54 + lVar66);
                  fVar88 = *(float *)((long)pvVar54 + lVar66 + 4);
                  fVar89 = *(float *)((long)pvVar54 + lVar66 + 8);
                  fVar90 = *(float *)((long)pvVar63 + lVar66);
                  fVar91 = *(float *)((long)pvVar63 + lVar66 + 4);
                  fVar92 = *(float *)((long)pvVar63 + lVar66 + 8);
                  pauVar57 = (undefined1 (*) [16])(pauVar67[4] + lVar66 * 4);
                  fVar12 = *(float *)(pauVar57[-4] + 4);
                  fVar13 = *(float *)(pauVar57[-4] + 8);
                  fVar14 = *(float *)(pauVar57[-4] + 0xc);
                  fVar79 = auVar41._0_4_;
                  fVar80 = auVar41._4_4_;
                  fVar81 = auVar41._8_4_;
                  local_198 = auVar39._0_4_;
                  fVar93 = *(float *)((long)pvVar64 + lVar66 + 0xc);
                  fVar10 = *(float *)((long)pvVar54 + lVar66 + 0xc);
                  fVar11 = *(float *)((long)pvVar63 + lVar66 + 0xc);
                  *(float *)pauVar57[-4] =
                       fVar84 * local_1b8 + *(float *)pauVar57[-4] + fVar88 * local_1d8 +
                       fVar79 * fVar90 + fVar92 * fVar23 +
                       fVar91 * local_198 +
                       fVar89 * local_1c8 + fVar87 * fVar27 + fVar85 * local_1a8 + fVar86 * fVar36;
                  *(float *)(pauVar57[-4] + 4) =
                       fVar84 * fStack_1b4 + fVar12 + fVar88 * fStack_1d4 + fVar80 * fVar90 +
                       fVar92 * fVar24 +
                       fVar91 * fStack_194 +
                       fVar89 * fStack_1c4 + fVar87 * fVar28 + fVar85 * fStack_1a4 + fVar86 * fVar4;
                  *(float *)(pauVar57[-4] + 8) =
                       fVar84 * fStack_1b0 + fVar13 + fVar88 * fStack_1d0 + fVar81 * fVar90 +
                       fVar92 * fVar25 +
                       fVar91 * fStack_190 +
                       fVar89 * fStack_1c0 + fVar87 * fVar29 + fVar85 * fStack_1a0 + fVar86 * fVar5;
                  *(float *)(pauVar57[-4] + 0xc) =
                       fVar84 * fStack_1ac + fVar14 + fVar88 * fStack_1cc + fVar35 * fVar90 +
                       fVar92 * fVar26 +
                       fVar91 * fStack_18c +
                       fVar89 * fStack_1bc + fVar87 * fVar30 + fVar85 * fStack_19c + fVar86 * fVar6;
                  fVar12 = *(float *)(pauVar57[-3] + 4);
                  fVar13 = *(float *)(pauVar57[-3] + 8);
                  fVar14 = *(float *)(pauVar57[-3] + 0xc);
                  fVar84 = *(float *)((long)pvVar64 + lVar66 + 0x10);
                  fVar87 = *(float *)((long)pvVar54 + lVar66 + 0x10);
                  fVar90 = *(float *)((long)pvVar63 + lVar66 + 0x10);
                  *(float *)pauVar57[-3] =
                       fVar86 * local_1a8 + fVar85 * local_1b8 +
                       fVar27 * fVar88 + fVar89 * local_1d8 + *(float *)pauVar57[-3] +
                       fVar11 * fVar23 +
                       fVar10 * local_1c8 + fVar92 * local_198 + fVar91 * fVar79 + fVar93 * fVar36;
                  *(float *)(pauVar57[-3] + 4) =
                       fVar86 * fStack_1a4 + fVar85 * fStack_1b4 +
                       fVar28 * fVar88 + fVar89 * fStack_1d4 + fVar12 +
                       fVar11 * fVar24 +
                       fVar10 * fStack_1c4 + fVar92 * fStack_194 + fVar91 * fVar80 + fVar93 * fVar4;
                  *(float *)(pauVar57[-3] + 8) =
                       fVar86 * fStack_1a0 + fVar85 * fStack_1b0 +
                       fVar29 * fVar88 + fVar89 * fStack_1d0 + fVar13 +
                       fVar11 * fVar25 +
                       fVar10 * fStack_1c0 + fVar92 * fStack_190 + fVar91 * fVar81 + fVar93 * fVar5;
                  *(float *)(pauVar57[-3] + 0xc) =
                       fVar86 * fStack_19c + fVar85 * fStack_1ac +
                       fVar30 * fVar88 + fVar89 * fStack_1cc + fVar14 +
                       fVar11 * fVar26 +
                       fVar10 * fStack_1bc + fVar92 * fStack_18c + fVar91 * fVar35 + fVar93 * fVar6;
                  fVar12 = *(float *)(pauVar57[-2] + 4);
                  fVar13 = *(float *)(pauVar57[-2] + 8);
                  fVar14 = *(float *)(pauVar57[-2] + 0xc);
                  fVar85 = *(float *)((long)pvVar64 + lVar66 + 0x14);
                  fVar88 = *(float *)((long)pvVar54 + lVar66 + 0x14);
                  fVar91 = *(float *)((long)pvVar63 + lVar66 + 0x14);
                  *(float *)pauVar57[-2] =
                       fVar10 * local_1d8 + fVar11 * local_198 + fVar84 * fVar36 +
                       fVar87 * local_1c8 + fVar90 * fVar23 +
                       fVar92 * fVar79 + fVar93 * local_1a8 + fVar89 * fVar27 + fVar86 * local_1b8 +
                       *(float *)pauVar57[-2];
                  *(float *)(pauVar57[-2] + 4) =
                       fVar10 * fStack_1d4 + fVar11 * fStack_194 + fVar84 * fVar4 +
                       fVar87 * fStack_1c4 + fVar90 * fVar24 +
                       fVar92 * fVar80 + fVar93 * fVar7 + fVar89 * fVar28 + fVar86 * fStack_1b4 +
                       fVar12;
                  *(float *)(pauVar57[-2] + 8) =
                       fVar10 * fStack_1d0 + fVar11 * fStack_190 + fVar84 * fVar5 +
                       fVar87 * fStack_1c0 + fVar90 * fVar25 +
                       fVar92 * fVar81 + fVar93 * fVar8 + fVar89 * fVar29 + fVar86 * fStack_1b0 +
                       fVar13;
                  *(float *)(pauVar57[-2] + 0xc) =
                       fVar10 * fStack_1cc + fVar11 * fStack_18c + fVar84 * fVar6 +
                       fVar87 * fStack_1bc + fVar90 * fVar26 +
                       fVar92 * fVar35 + fVar93 * fVar31 + fVar89 * fVar30 + fVar86 * fStack_1ac +
                       fVar14;
                  auVar71._0_4_ =
                       fVar27 * fVar10 + fVar93 * local_1b8 + fVar79 * fVar11 + fVar84 * local_1a8 +
                       *(float *)pauVar57[-1] +
                       fVar87 * local_1d8 + fVar90 * local_198 + fVar85 * local_1f8 +
                       fVar88 * local_1c8 + fVar91 * fVar23;
                  auVar71._4_4_ =
                       fVar28 * fVar10 + fVar93 * fStack_1b4 + fVar80 * fVar11 + fVar84 * fVar7 +
                       *(float *)(pauVar57[-1] + 4) +
                       fVar87 * fStack_1d4 + fVar90 * fStack_194 + fVar85 * fVar4 +
                       fVar88 * fStack_1c4 + fVar91 * fVar24;
                  auVar71._8_4_ =
                       fVar29 * fVar10 + fVar93 * fStack_1b0 + fVar81 * fVar11 + fVar84 * fVar8 +
                       *(float *)(pauVar57[-1] + 8) +
                       fVar87 * fStack_1d0 + fVar90 * fStack_190 + fVar85 * fStack_1f0 +
                       fVar88 * fStack_1c0 + fVar91 * fVar25;
                  auVar71._12_4_ =
                       fVar30 * fVar10 + fVar93 * fStack_1ac + fVar35 * fVar11 + fVar84 * fVar31 +
                       *(float *)(pauVar57[-1] + 0xc) +
                       fVar87 * fStack_1cc + fVar90 * fStack_18c + fVar85 * fVar6 +
                       fVar88 * fStack_1bc + fVar91 * fVar26;
                  pauVar57[-1] = auVar71;
                  iVar59 = iVar59 + 4;
                  lVar66 = lVar66 + 0x10;
                } while (iVar59 < (int)uVar20);
                pvVar63 = (void *)((long)pvVar63 + lVar66);
                pvVar54 = (void *)((long)pvVar54 + lVar66);
                pvVar64 = (void *)((long)pvVar64 + lVar66);
                pauVar57 = pauVar68 + 4;
                uVar50 = uVar20 & 0xfffffffc;
                fVar84 = fVar9;
                fVar85 = fStack_194;
                fVar86 = fStack_190;
                fVar87 = fStack_18c;
                fVar88 = local_1a8;
                fVar89 = fStack_1a4;
                fVar90 = fStack_1a0;
                fVar91 = fStack_19c;
                fVar92 = local_1f8;
                fVar93 = fStack_1f0;
              }
              if ((int)(uVar50 | 1) < (int)uVar20) {
                lVar66 = 0;
                pauVar67 = pauVar57;
                uVar49 = uVar50;
                do {
                  pauVar68 = pauVar67;
                  fVar84 = *(float *)((long)pvVar64 + lVar66);
                  fVar85 = *(float *)((long)pvVar64 + lVar66 + 4);
                  fVar86 = *(float *)((long)pvVar64 + lVar66 + 8);
                  fVar87 = *(float *)((long)pvVar54 + lVar66);
                  fVar88 = *(float *)((long)pvVar54 + lVar66 + 4);
                  fVar89 = *(float *)((long)pvVar54 + lVar66 + 8);
                  fVar90 = *(float *)((long)pvVar63 + lVar66);
                  fVar91 = *(float *)((long)pvVar63 + lVar66 + 4);
                  fVar92 = *(float *)((long)pvVar63 + lVar66 + 8);
                  pauVar67 = (undefined1 (*) [16])(pauVar57[2] + lVar66 * 4);
                  fVar12 = *(float *)(pauVar67[-2] + 4);
                  fVar13 = *(float *)(pauVar67[-2] + 8);
                  fVar14 = *(float *)(pauVar67[-2] + 0xc);
                  fVar93 = *(float *)((long)pvVar64 + lVar66 + 0xc);
                  fVar10 = *(float *)((long)pvVar54 + lVar66 + 0xc);
                  fVar11 = *(float *)((long)pvVar63 + lVar66 + 0xc);
                  *(float *)pauVar67[-2] =
                       fVar85 * local_1a8 + fVar86 * local_1f8 + fVar87 * auVar42._0_4_ +
                       local_1c8 * fVar89 + fVar91 * fVar9 +
                       fVar92 * fVar23 +
                       fVar90 * auVar44._0_4_ +
                       local_1d8 * fVar88 + fVar84 * local_1b8 + *(float *)pauVar67[-2];
                  *(float *)(pauVar67[-2] + 4) =
                       fVar85 * fVar7 + fVar86 * fVar4 + fVar87 * auVar42._4_4_ +
                       fStack_1c4 * fVar89 + fVar91 * fStack_194 +
                       fVar92 * fVar24 +
                       fVar90 * auVar44._4_4_ + fStack_1d4 * fVar88 + fVar84 * fStack_1b4 + fVar12;
                  *(float *)(pauVar67[-2] + 8) =
                       fVar85 * fVar8 + fVar86 * fStack_1f0 + fVar87 * auVar42._8_4_ +
                       fStack_1c0 * fVar89 + fVar91 * fStack_190 +
                       fVar92 * fVar25 +
                       fVar90 * auVar44._8_4_ + fStack_1d0 * fVar88 + fVar84 * fStack_1b0 + fVar13;
                  *(float *)(pauVar67[-2] + 0xc) =
                       fVar85 * fVar31 + fVar86 * fVar6 + fVar87 * fVar30 + fStack_1bc * fVar89 +
                       fVar91 * fStack_18c +
                       fVar92 * fVar26 +
                       fVar90 * fVar35 + fStack_1cc * fVar88 + fVar84 * fStack_1ac + fVar14;
                  auVar72._0_4_ =
                       fVar86 * local_1a8 + fVar85 * local_1b8 +
                       local_1d8 * fVar89 + auVar42._0_4_ * fVar88 + *(float *)pauVar67[-1] +
                       auVar44._0_4_ * fVar91 + fVar92 * fVar9 + fVar93 * local_1f8 +
                       fVar10 * local_1c8 + fVar23 * fVar11;
                  auVar72._4_4_ =
                       fVar86 * fVar7 + fVar85 * fStack_1b4 +
                       fStack_1d4 * fVar89 + auVar42._4_4_ * fVar88 + *(float *)(pauVar67[-1] + 4) +
                       auVar44._4_4_ * fVar91 + fVar92 * fStack_194 + fVar93 * fVar4 +
                       fVar10 * fStack_1c4 + fVar24 * fVar11;
                  auVar72._8_4_ =
                       fVar86 * fVar8 + fVar85 * fStack_1b0 +
                       fStack_1d0 * fVar89 + auVar42._8_4_ * fVar88 + *(float *)(pauVar67[-1] + 8) +
                       auVar44._8_4_ * fVar91 + fVar92 * fStack_190 + fVar93 * fStack_1f0 +
                       fVar10 * fStack_1c0 + fVar25 * fVar11;
                  auVar72._12_4_ =
                       fVar86 * fVar31 + fVar85 * fStack_1ac + fStack_1cc * fVar89 + fVar30 * fVar88
                       + *(float *)(pauVar67[-1] + 0xc) +
                       fVar35 * fVar91 + fVar92 * fStack_18c + fVar93 * fVar6 + fVar10 * fStack_1bc
                       + fVar26 * fVar11;
                  pauVar67[-1] = auVar72;
                  uVar50 = uVar49 + 2;
                  iVar59 = uVar49 + 3;
                  lVar66 = lVar66 + 8;
                  uVar49 = uVar50;
                } while (iVar59 < (int)uVar20);
                pauVar57 = pauVar68 + 2;
                pvVar63 = (void *)((long)pvVar63 + lVar66);
                pvVar54 = (void *)((long)pvVar54 + lVar66);
                pvVar64 = (void *)((long)pvVar64 + lVar66);
                fVar84 = fVar9;
                fVar85 = fStack_194;
                fVar86 = fStack_190;
                fVar87 = fStack_18c;
                fVar88 = local_1a8;
                fVar89 = fStack_1a4;
                fVar90 = fStack_1a0;
                fVar91 = fStack_19c;
                fVar92 = local_1f8;
                fVar93 = fStack_1f0;
              }
              iVar59 = uVar20 - uVar50;
              pauVar67 = pauVar57;
              if (iVar59 != 0 && (int)uVar50 <= (int)uVar20) {
                lVar66 = 0;
                do {
                  fVar7 = *(float *)((long)pvVar64 + lVar66);
                  fVar8 = *(float *)((long)pvVar64 + lVar66 + 4);
                  fVar9 = *(float *)((long)pvVar64 + lVar66 + 8);
                  fVar10 = *(float *)((long)pvVar54 + lVar66);
                  pfVar2 = (float *)((long)*pauVar57 + lVar66 * 4);
                  fVar11 = *(float *)((long)pvVar54 + lVar66 + 4);
                  fVar12 = *(float *)((long)pvVar54 + lVar66 + 8);
                  fVar13 = *(float *)((long)pvVar63 + lVar66);
                  fVar14 = *(float *)((long)pvVar63 + lVar66 + 4);
                  fVar79 = *(float *)((long)pvVar63 + lVar66 + 8);
                  auVar73._0_4_ =
                       local_1b8 * fVar7 + *pfVar2 + local_1d8 * fVar11 + fVar32 * fVar13 +
                       fVar79 * fVar23 +
                       fVar88 * fVar8 + fVar92 * fVar9 + fVar10 * fVar27 + local_1c8 * fVar12 +
                       fVar84 * fVar14;
                  auVar73._4_4_ =
                       fStack_1b4 * fVar7 + pfVar2[1] + fStack_1d4 * fVar11 + fVar33 * fVar13 +
                       fVar79 * fVar24 +
                       fVar89 * fVar8 + fVar4 * fVar9 + fVar10 * fVar28 + fStack_1c4 * fVar12 +
                       fVar85 * fVar14;
                  auVar73._8_4_ =
                       fStack_1b0 * fVar7 + pfVar2[2] + fStack_1d0 * fVar11 + fVar34 * fVar13 +
                       fVar79 * fVar25 +
                       fVar90 * fVar8 + fVar93 * fVar9 + fVar10 * fVar29 + fStack_1c0 * fVar12 +
                       fVar86 * fVar14;
                  auVar73._12_4_ =
                       fStack_1ac * fVar7 + pfVar2[3] + fStack_1cc * fVar11 + fVar35 * fVar13 +
                       fVar79 * fVar26 +
                       fVar91 * fVar8 + fVar6 * fVar9 + fVar10 * fVar30 + fStack_1bc * fVar12 +
                       fVar87 * fVar14;
                  *(undefined1 (*) [16])((long)*pauVar57 + lVar66 * 4) = auVar73;
                  pauVar67 = pauVar67 + 1;
                  lVar66 = lVar66 + 4;
                  iVar59 = iVar59 + -1;
                } while (iVar59 != 0);
                pvVar63 = (void *)((long)pvVar63 + lVar66);
                pvVar54 = (void *)((long)pvVar54 + lVar66);
                pvVar64 = (void *)((long)pvVar64 + lVar66);
              }
              pvVar64 = (void *)((long)pvVar64 + 8);
              pvVar54 = (void *)((long)pvVar54 + 8);
              pvVar63 = (void *)((long)pvVar63 + 8);
              iVar48 = iVar48 + 1;
            } while (iVar48 != iVar21);
          }
          pauVar62 = pauVar62 + 9;
          uVar65 = uVar65 + 1;
        } while (uVar65 != uVar19);
      }
      uVar55 = uVar55 + 1;
    } while ((long)uVar55 < (long)iVar22);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum02 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                    outptr1 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00 = _mm_loadu_ps(k0);
            __m128 _k01 = _mm_loadu_ps(k0 + 4);
            __m128 _k02 = _mm_loadu_ps(k0 + 8);
            __m128 _k10 = _mm_loadu_ps(k0 + 12);
            __m128 _k11 = _mm_loadu_ps(k0 + 16);
            __m128 _k12 = _mm_loadu_ps(k0 + 20);
            __m128 _k20 = _mm_loadu_ps(k0 + 24);
            __m128 _k21 = _mm_loadu_ps(k0 + 28);
            __m128 _k22 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m128 _sum2 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));
                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    _sum2 = _mm_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m128 _sum3 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    _mm_storeu_ps(outptr0 + 8, _sum2);

                    _sum3 = _mm_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm_storeu_ps(outptr0 + 12, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
        }
    }
}